

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O3

void __thiscall
FPNGTexture::FPNGTexture
          (FPNGTexture *this,FileReader *lump,int lumpnum,FString *filename,int width,int height,
          BYTE depth,BYTE colortype,BYTE interlace)

{
  undefined1 *puVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  BYTE *pBVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  DWORD len;
  DWORD hoty;
  DWORD hotx;
  BYTE trans [256];
  anon_union_1024_2_8a3eb4f6 p;
  uint local_55c;
  int local_558;
  int local_554;
  BYTE **local_550;
  uint local_548;
  uint local_544;
  FString *local_540;
  ushort local_538;
  ushort local_536;
  ushort local_534;
  uint uStack_438;
  byte abStack_432 [2];
  DWORD local_430 [256];
  
  local_554 = lumpnum;
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPNGTexture_0088cab0;
  local_540 = &this->SourceFile;
  FString::AttachToOther(local_540,filename);
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  this->BitDepth = depth;
  this->ColorType = colortype;
  this->Interlace = interlace;
  this->HaveTrans = false;
  this->PaletteMap = (BYTE *)0x0;
  this->PaletteSize = 0;
  this->StartOfIDAT = 0;
  (this->super_FTexture).UseType = '\b';
  (this->super_FTexture).LeftOffset = 0;
  (this->super_FTexture).TopOffset = 0;
  puVar1 = &(this->super_FTexture).field_0x31;
  *puVar1 = *puVar1 & 0xf7;
  (this->super_FTexture).Width = (WORD)width;
  (this->super_FTexture).Height = (WORD)height;
  FTexture::CalcBitSize(&this->super_FTexture);
  memset(&local_538,0xff,0x100);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0x21,0);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_55c,4);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_558,4);
  local_550 = &this->PaletteMap;
  while ((local_558 != 0x444e4549 && (local_558 != 0x54414449))) {
    local_55c = local_55c >> 0x18 | (local_55c & 0xff0000) >> 8 | (local_55c & 0xff00) << 8 |
                local_55c << 0x18;
    if (local_558 < 0x62417267) {
      if (local_558 == 0x45544c50) {
        uVar4 = local_55c / 3;
        if (0xff < local_55c / 3) {
          uVar4 = 0x100;
        }
        this->PaletteSize = uVar4;
        (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])
                  (lump,abStack_432 + 2,(ulong)(uVar4 * 3));
        uVar4 = this->PaletteSize;
        uVar10 = local_55c + uVar4 * -3;
        if (uVar10 != 0) {
          (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,(ulong)uVar10,1);
          uVar4 = this->PaletteSize;
        }
        if (0 < (int)uVar4) {
          lVar9 = (ulong)uVar4 * 3 + -1;
          uVar6 = (ulong)uVar4 + 1;
          do {
            (&uStack_438)[uVar6] =
                 (uint)abStack_432[lVar9 + 2] |
                 (uint)abStack_432[lVar9 + 1] << 8 | (uint)abStack_432[lVar9] << 0x10;
            uVar6 = uVar6 - 1;
            lVar9 = lVar9 + -3;
          } while (1 < uVar6);
        }
      }
      else if (local_558 == 0x534e5274) {
        (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_538,(ulong)local_55c);
        this->HaveTrans = true;
        this->NonPaletteTrans[0] = local_538 << 8 | local_538 >> 8;
        this->NonPaletteTrans[1] = local_536 << 8 | local_536 >> 8;
        this->NonPaletteTrans[2] = local_534 << 8 | local_534 >> 8;
      }
      else {
LAB_0065cc9f:
        (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,(ulong)local_55c,1);
      }
    }
    else if (local_558 == 0x62417267) {
      (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_544,4);
      (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_548,4);
      uVar10 = local_548;
      uVar4 = local_544 >> 0x18 | (local_544 & 0xff0000) >> 8;
      uVar11 = uVar4 | (local_544 & 0xff00) << 8 | local_544 << 0x18;
      if ((int)(short)uVar4 != uVar11) {
        pcVar7 = FWadCollection::GetLumpFullName(&Wads,local_554);
        Printf("X-Offset for PNG texture %s is bad: %d (0x%08x)\n",pcVar7,(ulong)uVar11,
               (ulong)uVar11);
        uVar11 = 0;
      }
      uVar4 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8;
      uVar10 = uVar4 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      if ((int)(short)uVar4 != uVar10) {
        pcVar7 = FWadCollection::GetLumpFullName(&Wads,local_554);
        Printf("Y-Offset for PNG texture %s is bad: %d (0x%08x)\n",pcVar7,(ulong)uVar10,
               (ulong)uVar10);
        uVar10 = 0;
      }
      (this->super_FTexture).LeftOffset = (SWORD)uVar11;
      (this->super_FTexture).TopOffset = (SWORD)uVar10;
    }
    else {
      if (local_558 != 0x68506c61) goto LAB_0065cc9f;
      puVar1 = &(this->super_FTexture).field_0x31;
      *puVar1 = *puVar1 | 0x18;
    }
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,4,1);
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_55c,4);
    local_558 = 0x444e4549;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_558,4);
  }
  iVar5 = (*(lump->super_FileReaderBase)._vptr_FileReaderBase[3])(lump);
  this->StartOfIDAT = iVar5 - 8;
  switch(colortype) {
  case '\0':
    uVar3 = *(ushort *)&(this->super_FTexture).field_0x31;
    if ((uVar3 & 0x10) != 0) {
      return;
    }
    if ((this->HaveTrans == true) && (uVar2 = this->NonPaletteTrans[0], (ulong)uVar2 < 0x100)) {
      *(ushort *)&(this->super_FTexture).field_0x31 = uVar3 | 8;
      this->PaletteSize = 0x100;
      pBVar8 = (BYTE *)operator_new__(0x100);
      *local_550 = pBVar8;
      memcpy(pBVar8,FTexture::GrayMap,0x100);
      pBVar8[uVar2] = '\0';
      return;
    }
    goto LAB_0065cf73;
  case '\x02':
    *(ushort *)&(this->super_FTexture).field_0x31 =
         (*(ushort *)&(this->super_FTexture).field_0x31 & 0xfff7) + (ushort)this->HaveTrans * 8;
    break;
  case '\x03':
    iVar5 = this->PaletteSize;
    pBVar8 = (BYTE *)operator_new__((long)iVar5);
    *local_550 = pBVar8;
    FPalette::MakeRemap(&GPalette,(DWORD *)(abStack_432 + 2),pBVar8,(BYTE *)&local_538,iVar5);
    iVar5 = this->PaletteSize;
    if (0 < iVar5) {
      lVar9 = 0;
      do {
        if (*(char *)((long)&local_538 + lVar9) == '\0') {
          puVar1 = &(this->super_FTexture).field_0x31;
          *puVar1 = *puVar1 | 8;
          this->PaletteMap[lVar9] = '\0';
          iVar5 = this->PaletteSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar5);
    }
    break;
  case '\x04':
    uVar3 = *(ushort *)&(this->super_FTexture).field_0x31;
    *(ushort *)&(this->super_FTexture).field_0x31 = uVar3 | 8;
    if ((uVar3 & 0x10) != 0) {
      return;
    }
LAB_0065cf73:
    *local_550 = FTexture::GrayMap;
    break;
  case '\x06':
    puVar1 = &(this->super_FTexture).field_0x31;
    *puVar1 = *puVar1 | 8;
  }
  return;
}

Assistant:

FPNGTexture::FPNGTexture (FileReader &lump, int lumpnum, const FString &filename, int width, int height,
						  BYTE depth, BYTE colortype, BYTE interlace)
: FTexture(NULL, lumpnum), SourceFile(filename), Pixels(0), Spans(0),
  BitDepth(depth), ColorType(colortype), Interlace(interlace), HaveTrans(false),
  PaletteMap(0), PaletteSize(0), StartOfIDAT(0)
{
	union
	{
		DWORD palette[256];
		BYTE pngpal[256][3];
	} p;
	BYTE trans[256];
	DWORD len, id;
	int i;

	UseType = TEX_MiscPatch;
	LeftOffset = 0;
	TopOffset = 0;
	bMasked = false;

	Width = width;
	Height = height;
	CalcBitSize ();

	memset(trans, 255, 256);

	// Parse pre-IDAT chunks. I skip the CRCs. Is that bad?
	lump.Seek(33, SEEK_SET);

	lump.Read(&len, 4);
	lump.Read(&id, 4);
	while (id != MAKE_ID('I','D','A','T') && id != MAKE_ID('I','E','N','D'))
	{
		len = BigLong((unsigned int)len);
		switch (id)
		{
		default:
			lump.Seek (len, SEEK_CUR);
			break;

		case MAKE_ID('g','r','A','b'):
			// This is like GRAB found in an ILBM, except coordinates use 4 bytes
			{
				DWORD hotx, hoty;
				int ihotx, ihoty;
				
				lump.Read(&hotx, 4);
				lump.Read(&hoty, 4);
				ihotx = BigLong((int)hotx);
				ihoty = BigLong((int)hoty);
				if (ihotx < -32768 || ihotx > 32767)
				{
					Printf ("X-Offset for PNG texture %s is bad: %d (0x%08x)\n", Wads.GetLumpFullName (lumpnum), ihotx, ihotx);
					ihotx = 0;
				}
				if (ihoty < -32768 || ihoty > 32767)
				{
					Printf ("Y-Offset for PNG texture %s is bad: %d (0x%08x)\n", Wads.GetLumpFullName (lumpnum), ihoty, ihoty);
					ihoty = 0;
				}
				LeftOffset = ihotx;
				TopOffset = ihoty;
			}
			break;

		case MAKE_ID('P','L','T','E'):
			PaletteSize = MIN<int> (len / 3, 256);
			lump.Read (p.pngpal, PaletteSize * 3);
			if (PaletteSize * 3 != (int)len)
			{
				lump.Seek (len - PaletteSize * 3, SEEK_CUR);
			}
			for (i = PaletteSize - 1; i >= 0; --i)
			{
				p.palette[i] = MAKERGB(p.pngpal[i][0], p.pngpal[i][1], p.pngpal[i][2]);
			}
			break;

		case MAKE_ID('t','R','N','S'):
			lump.Read (trans, len);
			HaveTrans = true;
			// Save for colortype 2
			NonPaletteTrans[0] = WORD(trans[0] * 256 + trans[1]);
			NonPaletteTrans[1] = WORD(trans[2] * 256 + trans[3]);
			NonPaletteTrans[2] = WORD(trans[4] * 256 + trans[5]);
			break;

		case MAKE_ID('a','l','P','h'):
			bAlphaTexture = true;
			bMasked = true;
			break;
		}
		lump.Seek(4, SEEK_CUR);		// Skip CRC
		lump.Read(&len, 4);
		id = MAKE_ID('I','E','N','D');
		lump.Read(&id, 4);
	}
	StartOfIDAT = lump.Tell() - 8;

	switch (colortype)
	{
	case 4:		// Grayscale + Alpha
		bMasked = true;
		// intentional fall-through

	case 0:		// Grayscale
		if (!bAlphaTexture)
		{
			if (colortype == 0 && HaveTrans && NonPaletteTrans[0] < 256)
			{
				bMasked = true;
				PaletteSize = 256;
				PaletteMap = new BYTE[256];
				memcpy (PaletteMap, GrayMap, 256);
				PaletteMap[NonPaletteTrans[0]] = 0;
			}
			else
			{
				PaletteMap = GrayMap;
			}
		}
		break;

	case 3:		// Paletted
		PaletteMap = new BYTE[PaletteSize];
		GPalette.MakeRemap (p.palette, PaletteMap, trans, PaletteSize);
		for (i = 0; i < PaletteSize; ++i)
		{
			if (trans[i] == 0)
			{
				bMasked = true;
				PaletteMap[i] = 0;
			}
		}
		break;

	case 6:		// RGB + Alpha
		bMasked = true;
		break;

	case 2:		// RGB
		bMasked = HaveTrans;
		break;
	}
}